

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

BlockSet * __thiscall
spvtools::opt::InvocationInterlockPlacementPass::computeReachableBlocks
          (BlockSet *__return_storage_ptr__,InvocationInterlockPlacementPass *this,
          BlockSet *previous_inside,BlockSet *starting_nodes,bool reverse_cfg)

{
  uint32_t block_id_00;
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  anon_class_24_3_8a3dcb9c local_130;
  function<void_(unsigned_int)> local_118;
  uint32_t local_f4;
  undefined1 local_f0 [4];
  uint32_t block_id;
  _Node_iterator_base<unsigned_int,_false> local_d0;
  _Node_iterator_base<unsigned_int,_false> local_c8;
  iterator local_c0;
  const_iterator local_a0;
  undefined1 local_80 [8];
  deque<unsigned_int,_std::allocator<unsigned_int>_> worklist;
  bool reverse_cfg_local;
  BlockSet *starting_nodes_local;
  BlockSet *previous_inside_local;
  InvocationInterlockPlacementPass *this_local;
  BlockSet *inside;
  
  worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._6_1_ = 0;
  worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = reverse_cfg;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(__return_storage_ptr__,starting_nodes);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::begin
            (&local_c0,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  std::_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*>::
  _Deque_iterator<std::_Deque_iterator<unsigned_int,unsigned_int&,unsigned_int*>,void>
            ((_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*> *)&local_a0,
             &local_c0);
  local_c8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin(starting_nodes);
  local_d0._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(starting_nodes);
  std::deque<unsigned_int,std::allocator<unsigned_int>>::
  insert<std::__detail::_Node_const_iterator<unsigned_int,true,false>,void>
            ((iterator *)local_f0,(deque<unsigned_int,std::allocator<unsigned_int>> *)local_80,
             &local_a0,(_Node_const_iterator<unsigned_int,_true,_false>)local_c8._M_cur,
             (_Node_const_iterator<unsigned_int,_true,_false>)local_d0._M_cur);
  while( true ) {
    bVar2 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar3 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::front
                       ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    local_f4 = *pvVar3;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    bVar1 = worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node._7_1_;
    block_id_00 = local_f4;
    local_130.worklist = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80;
    local_130.inside = __return_storage_ptr__;
    local_130.previous_inside = previous_inside;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::InvocationInterlockPlacementPass::computeReachableBlocks(std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&,bool)::__0,void>
              ((function<void(unsigned_int)> *)&local_118,&local_130);
    forEachNext(this,block_id_00,(bool)(bVar1 & 1),&local_118);
    std::function<void_(unsigned_int)>::~function(&local_118);
  }
  worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._6_1_ = 1;
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  if ((worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node._6_1_ & 1) == 0) {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

InvocationInterlockPlacementPass::BlockSet
InvocationInterlockPlacementPass::computeReachableBlocks(
    BlockSet& previous_inside, const BlockSet& starting_nodes,
    bool reverse_cfg) {
  BlockSet inside = starting_nodes;

  std::deque<uint32_t> worklist;
  worklist.insert(worklist.begin(), starting_nodes.begin(),
                  starting_nodes.end());

  while (!worklist.empty()) {
    uint32_t block_id = worklist.front();
    worklist.pop_front();

    forEachNext(block_id, reverse_cfg,
                [&inside, &previous_inside, &worklist](uint32_t next_id) {
                  previous_inside.insert(next_id);
                  if (inside.insert(next_id).second) {
                    worklist.push_back(next_id);
                  }
                });
  }

  return inside;
}